

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLCommonTest.cpp
# Opt level: O0

void __thiscall
ODDLParser::OpenDDLCommonTest_createTextTest_Test::~OpenDDLCommonTest_createTextTest_Test
          (OpenDDLCommonTest_createTextTest_Test *this)

{
  OpenDDLCommonTest_createTextTest_Test *this_local;
  
  ~OpenDDLCommonTest_createTextTest_Test(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_F(OpenDDLCommonTest, createTextTest) {
    bool ok(true);
    try {
        static_cast<void>(createTestText());
    } catch (...) {
        ok = false;
    }
    EXPECT_TRUE(ok);
}